

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void printfFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  sqlite3 *db_00;
  sqlite3_context *pCtx;
  long in_RDX;
  int in_ESI;
  sqlite3_context *in_RDI;
  sqlite3 *db;
  int n;
  char *zFormat;
  StrAccum str;
  PrintfArguments x;
  int n_00;
  undefined4 in_stack_ffffffffffffffa8;
  StrAccum local_48;
  int local_28 [2];
  long local_20;
  long local_18;
  int local_c;
  sqlite3_context *local_8;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  db_00 = sqlite3_context_db_handle(in_RDI);
  if (0 < local_c) {
    pCtx = (sqlite3_context *)sqlite3_value_text((sqlite3_value *)0x1dbab9);
    if (pCtx != (sqlite3_context *)0x0) {
      local_28[0] = local_c + -1;
      local_28[1] = 0;
      local_20 = local_18 + 8;
      sqlite3StrAccumInit(&local_48,db_00,(char *)0x0,0,db_00->aLimit[0]);
      n_00 = (int)((ulong)db_00 >> 0x20);
      local_48.printfFlags = '\x02';
      sqlite3_str_appendf(&local_48,(char *)pCtx,local_28);
      sqlite3StrAccumFinish((StrAccum *)local_8);
      sqlite3_result_text(pCtx,(char *)CONCAT44(local_48.nChar,in_stack_ffffffffffffffa8),n_00,
                          (_func_void_void_ptr *)local_8);
    }
  }
  return;
}

Assistant:

static void printfFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  PrintfArguments x;
  StrAccum str;
  const char *zFormat;
  int n;
  sqlite3 *db = sqlite3_context_db_handle(context);

  if( argc>=1 && (zFormat = (const char*)sqlite3_value_text(argv[0]))!=0 ){
    x.nArg = argc-1;
    x.nUsed = 0;
    x.apArg = argv+1;
    sqlite3StrAccumInit(&str, db, 0, 0, db->aLimit[SQLITE_LIMIT_LENGTH]);
    str.printfFlags = SQLITE_PRINTF_SQLFUNC;
    sqlite3_str_appendf(&str, zFormat, &x);
    n = str.nChar;
    sqlite3_result_text(context, sqlite3StrAccumFinish(&str), n,
                        SQLITE_DYNAMIC);
  }
}